

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void dfs(int head,int cur,int len,int *path)

{
  long lVar1;
  int *__k;
  int iVar2;
  int *piVar3;
  int iVar4;
  mapped_type *pmVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  int j;
  long lVar9;
  long lVar10;
  
  vis[cur] = true;
  lVar10 = (long)len;
  lVar1 = lVar10 + -1;
  path[lVar10 + -1] = cur;
  iVar6 = len + 2;
  for (lVar8 = 0; lVar8 < outDegrees[cur]; lVar8 = lVar8 + 1) {
    iVar2 = G[cur][lVar8];
    if ((isValid[iVar2] == head + 100) && (vis[iVar2] == false)) {
      __k = G[cur] + lVar8;
      if (isTail[iVar2] == -100 - head) {
        pmVar5 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)(pre.
                                  super__Vector_base<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + head),__k);
        piVar3 = (pmVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (piVar7 = (pmVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start; piVar7 != piVar3; piVar7 = piVar7 + 1) {
          if (vis[*piVar7] == false) {
            path[lVar10] = *__k;
            path[lVar10 + 1] = *piVar7;
            for (lVar9 = 0; lVar9 <= lVar10; lVar9 = lVar9 + 1) {
              iVar4 = sprintf(cycle[lVar1] + cycleNum[iVar6],"%d",(ulong)ids[path[lVar9]]);
              iVar2 = cycleNum[iVar6];
              cycleNum[iVar6] = (int)((long)iVar4 + (long)iVar2);
              cycle[lVar1][(long)iVar4 + (long)iVar2] = ',';
              cycleNum[iVar6] = cycleNum[iVar6] + 1;
            }
            iVar4 = sprintf(cycle[lVar1] + cycleNum[iVar6],"%d",(ulong)ids[path[lVar10 + 1]]);
            iVar2 = cycleNum[iVar6];
            cycleNum[iVar6] = (int)((long)iVar4 + (long)iVar2);
            cycle[lVar1][(long)iVar4 + (long)iVar2] = '\n';
            cycleNum[iVar6] = cycleNum[iVar6] + 1;
            ansNum = ansNum + 1;
          }
        }
      }
      if (len < 5) {
        dfs(head,*__k,len + 1,path);
      }
    }
  }
  vis[cur] = false;
  return;
}

Assistant:

void dfs(int head, int cur, int len, int path[]) {
    vis[cur] = true;
    path[len - 1] = cur;
    for (int i = 0; i < outDegrees[cur]; ++i) {
        int &v = G[cur][i];
        if (isValid[v] != (head + 100) || vis[v])continue;
        if (isTail[v] == (-100 - head)) {
            for (auto &x :pre[head][v]) {
                if (!vis[x]) {
                    path[len] = v;
                    path[len + 1] = x;
                    for (int j = 0; j < len + 1; ++j) {
                        cycleNum[len + 2] += sprintf(cycle[len - 1] + cycleNum[len + 2], "%d", ids[path[j]]);
                        cycle[len - 1][cycleNum[len + 2]] = ',';
                        ++cycleNum[len + 2];
                    }
                    cycleNum[len + 2] += sprintf(cycle[len - 1] + cycleNum[len + 2], "%d", ids[path[len + 1]]);
                    cycle[len - 1][cycleNum[len + 2]] = '\n';
                    ++cycleNum[len + 2];
                    ++ansNum;
                }
            }
        }
        if (len < 5) {
            dfs(head, v, len + 1, path);
        }
    }
    vis[cur] = false;
}